

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O2

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
          *sub)

{
  alias_tensor *this_00;
  long lVar1;
  alias_tensor_instance local_70;
  
  this_00 = &this->gamma;
  lVar1 = (sub->l->cached_output).super_tensor.m_k;
  (this->gamma).inst.super_tensor.m_n = 1;
  (this->gamma).inst.super_tensor.m_k = lVar1;
  (this->gamma).inst.super_tensor.m_nr = 1;
  (this->gamma).inst.super_tensor.m_nc = 1;
  (this->gamma).inst.super_tensor.m_size = lVar1;
  (this->gamma).inst.data_offset = 0;
  (this->gamma).inst.data_instance = (gpu_data *)0x0;
  (this->gamma).inst._annotation = (any *)0x0;
  (this->beta).inst.super_tensor.m_size = lVar1;
  (this->beta).inst.super_tensor.m_n = (this->gamma).inst.super_tensor.m_n;
  (this->beta).inst.super_tensor.m_k = (this->gamma).inst.super_tensor.m_k;
  (this->beta).inst.super_tensor.m_nr = (this->gamma).inst.super_tensor.m_nr;
  (this->beta).inst.super_tensor.m_nc = (this->gamma).inst.super_tensor.m_nc;
  (this->beta).inst.data_offset = 0;
  (this->beta).inst.data_instance = (gpu_data *)0x0;
  (this->beta).inst._annotation = (any *)0x0;
  resizable_tensor::set_size(&this->params,lVar1 * 2,1,1,1);
  alias_tensor::operator()(&local_70,this_00,(tensor *)this,0);
  tensor::operator=(&local_70.super_tensor,1.0);
  alias_tensor::operator()
            (&local_70,&this->beta,(tensor *)this,(this->gamma).inst.super_tensor.m_size);
  tensor::operator=(&local_70.super_tensor,0.0);
  alias_tensor::operator()(&local_70,this_00,(tensor *)this,0);
  resizable_tensor::copy_size(&this->running_means,&local_70.super_tensor);
  alias_tensor::operator()(&local_70,this_00,(tensor *)this,0);
  resizable_tensor::copy_size(&this->running_variances,&local_70.super_tensor);
  tensor::operator=(&(this->running_means).super_tensor,0.0);
  tensor::operator=(&(this->running_variances).super_tensor,1.0);
  this->num_updates = 0;
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            if (mode == FC_MODE)
            {
                gamma = alias_tensor(1,
                                sub.get_output().k(),
                                sub.get_output().nr(),
                                sub.get_output().nc());
            }
            else
            {
                gamma = alias_tensor(1, sub.get_output().k());
            }
            beta = gamma;

            params.set_size(gamma.size()+beta.size());

            gamma(params,0) = 1;
            beta(params,gamma.size()) = 0;

            running_means.copy_size(gamma(params,0));
            running_variances.copy_size(gamma(params,0));
            running_means = 0;
            running_variances = 1;
            num_updates = 0;
        }